

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fft4g.c
# Opt level: O1

void bitrv2conj(int n,int *ip,double *a)

{
  double *pdVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  int iVar5;
  uint uVar6;
  int iVar7;
  int iVar8;
  uint uVar9;
  ulong uVar10;
  ulong uVar11;
  long lVar12;
  ulong uVar13;
  long lVar14;
  long lVar15;
  long lVar16;
  long lVar17;
  
  *ip = 0;
  if (n < 9) {
    uVar9 = 8;
    uVar10 = 1;
  }
  else {
    uVar6 = 1;
    do {
      n = (uint)n >> 1;
      if (0 < (int)uVar6) {
        uVar10 = 0;
        do {
          ip[uVar6 + uVar10] = ip[uVar10] + n;
          uVar10 = uVar10 + 1;
        } while (uVar6 != uVar10);
      }
      uVar10 = (ulong)(uVar6 * 2);
      uVar9 = uVar6 * 0x10;
      uVar6 = uVar6 * 2;
    } while ((int)uVar9 < n);
  }
  iVar5 = (int)uVar10;
  uVar6 = iVar5 * 2;
  if (uVar9 == n) {
    if (0 < iVar5) {
      uVar11 = (ulong)uVar6;
      lVar12 = 0;
      uVar13 = 0;
      do {
        if (uVar13 != 0) {
          iVar7 = ip[uVar13];
          lVar16 = 0;
          do {
            lVar14 = (long)*(int *)((long)ip + lVar16) + (long)((int)uVar13 * 2);
            pdVar1 = (double *)((long)a + lVar16 * 4 + (long)iVar7 * 8);
            dVar2 = *pdVar1;
            dVar3 = pdVar1[1];
            dVar4 = a[lVar14 + 1];
            *pdVar1 = a[lVar14];
            pdVar1[1] = -dVar4;
            a[lVar14] = dVar2;
            a[lVar14 + 1] = -dVar3;
            iVar8 = (int)lVar14 + iVar5 * 4;
            dVar2 = pdVar1[uVar11];
            dVar3 = pdVar1[uVar11 + 1];
            dVar4 = a[(long)iVar8 + 1];
            pdVar1[uVar11] = a[iVar8];
            pdVar1[uVar11 + 1] = -dVar4;
            a[iVar8] = dVar2;
            a[(long)iVar8 + 1] = -dVar3;
            iVar8 = iVar8 + iVar5 * -2;
            dVar2 = pdVar1[uVar11 * 2];
            dVar3 = pdVar1[uVar11 * 2 + 1];
            dVar4 = a[(long)iVar8 + 1];
            pdVar1[uVar11 * 2] = a[iVar8];
            pdVar1[uVar11 * 2 + 1] = -dVar4;
            a[iVar8] = dVar2;
            a[(long)iVar8 + 1] = -dVar3;
            dVar2 = pdVar1[uVar11 * 3];
            dVar3 = pdVar1[uVar11 * 3 + 1];
            lVar14 = (long)(iVar8 + iVar5 * 4);
            dVar4 = a[lVar14 + 1];
            pdVar1[uVar11 * 3] = a[lVar14];
            pdVar1[uVar11 * 3 + 1] = -dVar4;
            a[lVar14] = dVar2;
            a[lVar14 + 1] = -dVar3;
            lVar16 = lVar16 + 4;
          } while (lVar12 != lVar16);
        }
        lVar16 = (long)((int)uVar13 * 2) + (long)ip[uVar13];
        a[lVar16 + 1] = -a[lVar16 + 1];
        iVar7 = (int)lVar16 + uVar6;
        iVar8 = iVar7 + uVar6;
        dVar2 = a[iVar7];
        dVar3 = a[(long)iVar7 + 1];
        dVar4 = a[(long)iVar8 + 1];
        a[iVar7] = a[iVar8];
        a[(long)iVar7 + 1] = -dVar4;
        a[iVar8] = dVar2;
        a[(long)iVar8 + 1] = -dVar3;
        a[(long)(int)(iVar8 + uVar6) + 1] = -a[(long)(int)(iVar8 + uVar6) + 1];
        uVar13 = uVar13 + 1;
        lVar12 = lVar12 + 4;
      } while (uVar13 != uVar10);
    }
  }
  else {
    a[1] = -a[1];
    a[(int)(uVar6 | 1)] = -a[(int)(uVar6 | 1)];
    if (1 < iVar5) {
      uVar11 = 1;
      lVar12 = 4;
      do {
        lVar14 = (long)ip[uVar11] * 8 + (ulong)uVar6 * 8 + 8;
        lVar16 = (long)ip[uVar11] * 8;
        lVar17 = 0;
        do {
          lVar15 = (long)*(int *)((long)ip + lVar17) + (long)((int)uVar11 * 2);
          dVar2 = *(double *)((long)a + lVar17 * 4 + lVar16);
          dVar3 = *(double *)((long)a + lVar17 * 4 + lVar16 + 8);
          dVar4 = a[lVar15 + 1];
          *(double *)((long)a + lVar17 * 4 + lVar16) = a[lVar15];
          *(double *)((long)a + lVar17 * 4 + lVar16 + 8) = -dVar4;
          a[lVar15] = dVar2;
          a[lVar15 + 1] = -dVar3;
          dVar2 = *(double *)((long)a + lVar17 * 4 + lVar14 + -8);
          dVar3 = *(double *)((long)a + lVar17 * 4 + lVar14);
          lVar15 = (long)(int)((int)lVar15 + uVar6);
          dVar4 = a[lVar15 + 1];
          *(double *)((long)a + lVar17 * 4 + lVar14 + -8) = a[lVar15];
          *(double *)((long)a + lVar17 * 4 + lVar14) = -dVar4;
          a[lVar15] = dVar2;
          a[lVar15 + 1] = -dVar3;
          lVar17 = lVar17 + 4;
        } while (lVar12 != lVar17);
        lVar16 = (long)((int)uVar11 * 2) + (long)ip[uVar11];
        a[lVar16 + 1] = -a[lVar16 + 1];
        lVar16 = (long)(int)((int)lVar16 + uVar6);
        a[lVar16 + 1] = -a[lVar16 + 1];
        uVar11 = uVar11 + 1;
        lVar12 = lVar12 + 4;
      } while (uVar11 != uVar10);
    }
  }
  return;
}

Assistant:

void bitrv2conj(int n, int *ip, double *a)
{
    int j, j1, k, k1, l, m, m2;
    double xr, xi, yr, yi;
    
    ip[0] = 0;
    l = n;
    m = 1;
    while ((m << 3) < l) {
        l >>= 1;
        for (j = 0; j < m; j++) {
            ip[m + j] = ip[j] + l;
        }
        m <<= 1;
    }
    m2 = 2 * m;
    if ((m << 3) == l) {
        for (k = 0; k < m; k++) {
            for (j = 0; j < k; j++) {
                j1 = 2 * j + ip[k];
                k1 = 2 * k + ip[j];
                xr = a[j1];
                xi = -a[j1 + 1];
                yr = a[k1];
                yi = -a[k1 + 1];
                a[j1] = yr;
                a[j1 + 1] = yi;
                a[k1] = xr;
                a[k1 + 1] = xi;
                j1 += m2;
                k1 += 2 * m2;
                xr = a[j1];
                xi = -a[j1 + 1];
                yr = a[k1];
                yi = -a[k1 + 1];
                a[j1] = yr;
                a[j1 + 1] = yi;
                a[k1] = xr;
                a[k1 + 1] = xi;
                j1 += m2;
                k1 -= m2;
                xr = a[j1];
                xi = -a[j1 + 1];
                yr = a[k1];
                yi = -a[k1 + 1];
                a[j1] = yr;
                a[j1 + 1] = yi;
                a[k1] = xr;
                a[k1 + 1] = xi;
                j1 += m2;
                k1 += 2 * m2;
                xr = a[j1];
                xi = -a[j1 + 1];
                yr = a[k1];
                yi = -a[k1 + 1];
                a[j1] = yr;
                a[j1 + 1] = yi;
                a[k1] = xr;
                a[k1 + 1] = xi;
            }
            k1 = 2 * k + ip[k];
            a[k1 + 1] = -a[k1 + 1];
            j1 = k1 + m2;
            k1 = j1 + m2;
            xr = a[j1];
            xi = -a[j1 + 1];
            yr = a[k1];
            yi = -a[k1 + 1];
            a[j1] = yr;
            a[j1 + 1] = yi;
            a[k1] = xr;
            a[k1 + 1] = xi;
            k1 += m2;
            a[k1 + 1] = -a[k1 + 1];
        }
    } else {
        a[1] = -a[1];
        a[m2 + 1] = -a[m2 + 1];
        for (k = 1; k < m; k++) {
            for (j = 0; j < k; j++) {
                j1 = 2 * j + ip[k];
                k1 = 2 * k + ip[j];
                xr = a[j1];
                xi = -a[j1 + 1];
                yr = a[k1];
                yi = -a[k1 + 1];
                a[j1] = yr;
                a[j1 + 1] = yi;
                a[k1] = xr;
                a[k1 + 1] = xi;
                j1 += m2;
                k1 += m2;
                xr = a[j1];
                xi = -a[j1 + 1];
                yr = a[k1];
                yi = -a[k1 + 1];
                a[j1] = yr;
                a[j1 + 1] = yi;
                a[k1] = xr;
                a[k1 + 1] = xi;
            }
            k1 = 2 * k + ip[k];
            a[k1 + 1] = -a[k1 + 1];
            a[k1 + m2 + 1] = -a[k1 + m2 + 1];
        }
    }
}